

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O1

void eclmap_rebuild(eclmap_t *emap)

{
  seqmap_t *psVar1;
  char **__base;
  char **ppcVar2;
  size_t __nmemb;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  
  __nmemb = emap->timeline_ins_names->len + emap->ins_names->len;
  free(emap->mnem_set);
  __base = (char **)malloc(__nmemb * 8);
  emap->mnem_set = __base;
  emap->mnem_set_len = __nmemb;
  psVar1 = emap->ins_names;
  sVar3 = psVar1->len;
  ppcVar2 = __base;
  lVar4 = sVar3 << 4;
  while( true ) {
    if (sVar3 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)&psVar1->ptr[-1].key + lVar4;
    }
    bVar7 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar7) break;
    *ppcVar2 = *(char **)(lVar5 + 8);
    ppcVar2 = ppcVar2 + 1;
    lVar4 = lVar4 + -0x10;
  }
  psVar1 = emap->timeline_ins_names;
  sVar3 = psVar1->len;
  lVar4 = sVar3 << 4;
  for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
    ppcVar2[sVar6] = *(char **)((long)&psVar1->ptr[-1].value + lVar4);
    lVar4 = lVar4 + -0x10;
  }
  qsort(__base,__nmemb,8,strcmp_indirect);
  return;
}

Assistant:

void
eclmap_rebuild(
    eclmap_t *emap)
{
    char **p;
    size_t count = emap->ins_names->len + emap->timeline_ins_names->len;

    free(emap->mnem_set);
    emap->mnem_set = p = malloc(count * sizeof(char*));
    emap->mnem_set_len = count;

    seqmap_entry_t *ent;
    seqmap_for_each(emap->ins_names, ent)
        *p++ = ent->value;
    seqmap_for_each(emap->timeline_ins_names, ent)
        *p++ = ent->value;

    qsort(emap->mnem_set, emap->mnem_set_len, sizeof(char*), strcmp_indirect);
}